

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode_ls.c
# Opt level: O0

int cvLsDenseDQJac(sunrealtype t,N_Vector y,N_Vector fy,SUNMatrix Jac,CVodeMem cv_mem,N_Vector tmp1)

{
  double dVar1;
  double dVar2;
  long lVar3;
  sunindextype sVar4;
  undefined8 uVar5;
  long lVar6;
  long lVar7;
  sunrealtype *psVar8;
  long in_RCX;
  SUNMatrix in_RDX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  undefined8 in_R8;
  undefined8 in_XMM0_Qa;
  int retval;
  CVLsMem cvls_mem;
  sunindextype N;
  sunindextype j;
  N_Vector jthCol;
  N_Vector ftemp;
  sunrealtype *cns_data;
  sunrealtype *ewt_data;
  sunrealtype *y_data;
  sunrealtype conj;
  sunrealtype srur;
  sunrealtype yjsaved;
  sunrealtype inc_inv;
  sunrealtype inc;
  sunrealtype minInc;
  sunrealtype fnorm;
  double local_c8;
  double local_c0;
  double local_b8;
  int local_ac;
  long local_98;
  long local_80;
  double local_48;
  
  local_ac = 0;
  local_80 = 0;
  lVar3 = *(long *)(in_RCX + 0x410);
  sVar4 = SUNDenseMatrix_Columns(in_RDX);
  uVar5 = N_VCloneEmpty(in_R8);
  lVar6 = N_VGetArrayPointer(*(undefined8 *)(in_RCX + 200));
  lVar7 = N_VGetArrayPointer(in_RDI);
  if (*(int *)(in_RCX + 0x58) != 0) {
    local_80 = N_VGetArrayPointer(*(undefined8 *)(in_RCX + 0x108));
  }
  if (0.0 < *(double *)(in_RCX + 8)) {
    local_b8 = sqrt(*(double *)(in_RCX + 8));
  }
  else {
    local_b8 = 0.0;
  }
  local_c0 = (double)N_VWrmsNorm(in_RSI,*(undefined8 *)(in_RCX + 200));
  if ((local_c0 != 0.0) || (NAN(local_c0))) {
    local_c0 = ABS(*(double *)(in_RCX + 0x140)) * 1000.0 * *(double *)(in_RCX + 8) * (double)sVar4 *
               local_c0;
  }
  else {
    local_c0 = 1.0;
  }
  for (local_98 = 0; local_98 < sVar4; local_98 = local_98 + 1) {
    psVar8 = SUNDenseMatrix_Column(in_RDX,local_98);
    N_VSetArrayPointer(psVar8,uVar5);
    dVar1 = *(double *)(lVar7 + local_98 * 8);
    if (local_b8 * ABS(dVar1) <= local_c0 / *(double *)(lVar6 + local_98 * 8)) {
      local_c8 = local_c0 / *(double *)(lVar6 + local_98 * 8);
    }
    else {
      local_c8 = local_b8 * ABS(dVar1);
    }
    local_48 = local_c8;
    if (*(int *)(in_RCX + 0x58) != 0) {
      dVar2 = *(double *)(local_80 + local_98 * 8);
      if ((ABS(dVar2) != 1.0) || (NAN(ABS(dVar2)))) {
        if ((ABS(dVar2) == 2.0) && ((!NAN(ABS(dVar2)) && ((dVar1 + local_c8) * dVar2 <= 0.0)))) {
          local_48 = -local_c8;
        }
      }
      else if ((dVar1 + local_c8) * dVar2 < 0.0) {
        local_48 = -local_c8;
      }
    }
    *(double *)(lVar7 + local_98 * 8) = local_48 + *(double *)(lVar7 + local_98 * 8);
    local_ac = (**(code **)(in_RCX + 0x10))(in_XMM0_Qa,in_RDI,in_R8,*(undefined8 *)(in_RCX + 0x18));
    *(long *)(lVar3 + 0x90) = *(long *)(lVar3 + 0x90) + 1;
    if (local_ac != 0) break;
    *(double *)(lVar7 + local_98 * 8) = dVar1;
    N_VLinearSum(1.0 / local_48,-(1.0 / local_48),in_R8,in_RSI,uVar5);
  }
  N_VSetArrayPointer(0,uVar5);
  N_VDestroy(uVar5);
  return local_ac;
}

Assistant:

int cvLsDenseDQJac(sunrealtype t, N_Vector y, N_Vector fy, SUNMatrix Jac,
                   CVodeMem cv_mem, N_Vector tmp1)
{
  sunrealtype fnorm, minInc, inc, inc_inv, yjsaved, srur, conj;
  sunrealtype *y_data, *ewt_data, *cns_data;
  N_Vector ftemp, jthCol;
  sunindextype j, N;
  CVLsMem cvls_mem;
  int retval = 0;

  /* initialize cns_data to avoid compiler warning */
  cns_data = NULL;

  /* access LsMem interface structure */
  cvls_mem = (CVLsMem)cv_mem->cv_lmem;

  /* access matrix dimension */
  N = SUNDenseMatrix_Columns(Jac);

  /* Rename work vector for readability */
  ftemp = tmp1;

  /* Create an empty vector for matrix column calculations */
  jthCol = N_VCloneEmpty(tmp1);

  /* Obtain pointers to the data for ewt, y */
  ewt_data = N_VGetArrayPointer(cv_mem->cv_ewt);
  y_data   = N_VGetArrayPointer(y);
  if (cv_mem->cv_constraintsSet)
  {
    cns_data = N_VGetArrayPointer(cv_mem->cv_constraints);
  }

  /* Set minimum increment based on uround and norm of f */
  srur   = SUNRsqrt(cv_mem->cv_uround);
  fnorm  = N_VWrmsNorm(fy, cv_mem->cv_ewt);
  minInc = (fnorm != ZERO) ? (MIN_INC_MULT * SUNRabs(cv_mem->cv_h) *
                              cv_mem->cv_uround * N * fnorm)
                           : ONE;

  for (j = 0; j < N; j++)
  {
    /* Generate the jth col of J(tn,y) */
    N_VSetArrayPointer(SUNDenseMatrix_Column(Jac, j), jthCol);

    yjsaved = y_data[j];
    inc     = SUNMAX(srur * SUNRabs(yjsaved), minInc / ewt_data[j]);

    /* Adjust sign(inc) if y_j has an inequality constraint. */
    if (cv_mem->cv_constraintsSet)
    {
      conj = cns_data[j];
      if (SUNRabs(conj) == ONE)
      {
        if ((yjsaved + inc) * conj < ZERO) { inc = -inc; }
      }
      else if (SUNRabs(conj) == TWO)
      {
        if ((yjsaved + inc) * conj <= ZERO) { inc = -inc; }
      }
    }

    y_data[j] += inc;

    retval = cv_mem->cv_f(t, y, ftemp, cv_mem->cv_user_data);
    cvls_mem->nfeDQ++;
    if (retval != 0) { break; }

    y_data[j] = yjsaved;

    inc_inv = ONE / inc;
    N_VLinearSum(inc_inv, ftemp, -inc_inv, fy, jthCol);
  }

  /* Destroy jthCol vector */
  N_VSetArrayPointer(NULL, jthCol); /* SHOULDN'T BE NEEDED */
  N_VDestroy(jthCol);

  return (retval);
}